

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageRectangle(gdImagePtr im,int x1,int y1,int x2,int y2,int color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int half;
  int y2lr;
  int x2lr;
  int y1ul;
  int x1ul;
  int cy;
  int cx;
  int t_1;
  int t;
  int thick;
  int color_local;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  gdImagePtr im_local;
  
  iVar1 = im->thick;
  if (((x1 == x2) && (y1 == y2)) && (iVar1 == 1)) {
    gdImageSetPixel(im,x1,y1,color);
  }
  else {
    thick = y2;
    y2_local = y1;
    if (y2 < y1) {
      thick = y1;
      y2_local = y2;
    }
    color_local = x2;
    x2_local = x1;
    if (x2 < x1) {
      color_local = x1;
      x2_local = x2;
    }
    if (iVar1 < 2) {
      if ((x2_local == color_local) || (y2_local == thick)) {
        gdImageLine(im,x2_local,y2_local,color_local,thick,color);
      }
      else {
        gdImageLine(im,x2_local,y2_local,color_local,y2_local,color);
        gdImageLine(im,x2_local,thick,color_local,thick,color);
        gdImageLine(im,x2_local,y2_local + 1,x2_local,thick + -1,color);
        gdImageLine(im,color_local,y2_local + 1,color_local,thick + -1,color);
      }
    }
    else {
      iVar2 = iVar1 >> 1;
      iVar3 = x2_local - iVar2;
      iVar4 = y2_local - iVar2;
      iVar5 = color_local + iVar2;
      iVar2 = thick + iVar2;
      y1ul = iVar4 + iVar1;
      while (iVar6 = y1ul + -1, iVar4 < y1ul) {
        x1ul = iVar3 + -1;
        while (y1ul = iVar6, x1ul < iVar5) {
          gdImageSetPixel(im,x1ul + 1,iVar6,color);
          x1ul = x1ul + 1;
        }
      }
      y1ul = iVar2 - iVar1;
      while (iVar6 = y1ul + 1, y1ul < iVar2) {
        x1ul = iVar3 + -1;
        while (y1ul = iVar6, x1ul < iVar5) {
          gdImageSetPixel(im,x1ul + 1,iVar6,color);
          x1ul = x1ul + 1;
        }
      }
      y1ul = iVar4 + iVar1 + -1;
      while (iVar6 = y1ul + 1, y1ul < iVar2 - iVar1) {
        x1ul = iVar3 + -1;
        while (y1ul = iVar6, x1ul < iVar3 + iVar1) {
          gdImageSetPixel(im,x1ul + 1,iVar6,color);
          x1ul = x1ul + 1;
        }
      }
      y1ul = iVar4 + iVar1 + -1;
      while (iVar3 = y1ul + 1, y1ul < iVar2 - iVar1) {
        x1ul = (iVar5 - iVar1) + -1;
        while (y1ul = iVar3, x1ul < iVar5) {
          gdImageSetPixel(im,x1ul + 1,iVar3,color);
          x1ul = x1ul + 1;
        }
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageRectangle (gdImagePtr im, int x1, int y1, int x2, int y2, int color)
{
	int thick = im->thick;

	if (x1 == x2 && y1 == y2 && thick == 1) {
		gdImageSetPixel(im, x1, y1, color);
		return;
	}

	if (y2 < y1) {
		int t = y1;
		y1 = y2;
		y2 = t;
	}

	if (x2 < x1) {
		int t = x1;
		x1 = x2;
		x2 = t;
	}

	if (thick > 1) {
		int cx, cy, x1ul, y1ul, x2lr, y2lr;
		int half = thick >> 1;
		x1ul = x1 - half;
		y1ul = y1 - half;

		x2lr = x2 + half;
		y2lr = y2 + half;

		cy = y1ul + thick;
		while (cy-- > y1ul) {
			cx = x1ul - 1;
			while (cx++ < x2lr) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		cy = y2lr - thick;
		while (cy++ < y2lr) {
			cx = x1ul - 1;
			while (cx++ < x2lr) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		cy = y1ul + thick - 1;
		while (cy++ < y2lr -thick) {
			cx = x1ul - 1;
			while (cx++ < x1ul + thick) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		cy = y1ul + thick - 1;
		while (cy++ < y2lr -thick) {
			cx = x2lr - thick - 1;
			while (cx++ < x2lr) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		return;
	} else {
		if (x1 == x2 || y1 == y2) {
			gdImageLine(im, x1, y1, x2, y2, color);
		} else {
			gdImageLine(im, x1, y1, x2, y1, color);
			gdImageLine(im, x1, y2, x2, y2, color);
			gdImageLine(im, x1, y1 + 1, x1, y2 - 1, color);
			gdImageLine(im, x2, y1 + 1, x2, y2 - 1, color);
		}
	}
}